

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

bool __thiscall IntElemDomain<0,_0,_0>::propagate(IntElemDomain<0,_0,_0> *this)

{
  Reason r_00;
  Reason r_01;
  Reason r_02;
  Reason r_03;
  Reason r_04;
  Reason r_05;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  Lit *pLVar6;
  IntView<0> *this_00;
  long in_RDI;
  int w;
  iterator i_4;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  IntView<0> *f_1;
  int v_1;
  int i_3;
  int i_2;
  int i_1;
  Lit l_1;
  Lit l;
  int reasonIndex;
  int i;
  Clause *r;
  int f;
  int *s;
  int v;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  iterator *in_stack_fffffffffffffe50;
  IntView<0> *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  Reason *in_stack_fffffffffffffe68;
  long in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Reason local_148 [4];
  int local_124;
  anon_union_8_2_743a5d44_for_Reason_0 local_f0;
  int local_e8;
  int local_e4;
  anon_union_8_2_743a5d44_for_Reason_0 local_e0;
  int64_t local_d8;
  anon_union_8_2_743a5d44_for_Reason_0 local_d0;
  int local_c8;
  int local_c4;
  anon_union_8_2_743a5d44_for_Reason_0 local_c0;
  int64_t local_b8;
  anon_union_8_2_743a5d44_for_Reason_0 local_b0;
  int local_a8;
  int local_a4;
  anon_union_8_2_743a5d44_for_Reason_0 local_a0;
  int64_t local_98;
  anon_union_8_2_743a5d44_for_Reason_0 local_90;
  int local_88;
  int local_84;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  int64_t local_78;
  IntView<0> *local_70;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  Reason local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  Clause *local_30;
  int local_24;
  uint *local_20;
  int local_14;
  bool local_1;
  
  iVar5 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
  for (local_14 = (int)iVar5; iVar4 = local_14,
      iVar5 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffe50), iVar4 <= (int)iVar5;
      local_14 = local_14 + 1) {
    bVar2 = IntView<0>::indomain
                      ((IntView<0> *)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      local_20 = *(uint **)(*(long *)(in_RDI + 0x50) + (long)local_14 * 8);
      local_24 = 0;
      iVar4 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x48) + (long)local_14 * 4));
      if (0 < iVar4) {
        bVar2 = IntView<0>::indomain
                          ((IntView<0> *)in_stack_fffffffffffffe50,
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (bVar2) {
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),*local_20);
          bVar2 = IntView<0>::indomain
                            ((IntView<0> *)in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          if (bVar2) goto LAB_0025f0b5;
        }
        do {
          bVar2 = IntView<0>::indomain
                            ((IntView<0> *)in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          if (bVar2) {
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_20[local_24]);
            bVar3 = IntView<0>::indomain
                              ((IntView<0> *)in_stack_fffffffffffffe50,
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            bVar2 = false;
            if (!bVar3) goto LAB_0025ec26;
          }
          else {
LAB_0025ec26:
            in_stack_fffffffffffffe94 = local_24 + 1;
            local_24 = in_stack_fffffffffffffe94;
            iVar4 = Tint::operator_cast_to_int
                              ((Tint *)(*(long *)(in_RDI + 0x48) + (long)local_14 * 4));
            bVar2 = in_stack_fffffffffffffe94 < iVar4;
          }
        } while (bVar2);
      }
      in_stack_fffffffffffffe90 = local_24;
      iVar4 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x48) + (long)local_14 * 4));
      if (in_stack_fffffffffffffe90 == iVar4) {
        local_30 = (Clause *)0x0;
        if ((so.lazy & 1U) != 0) {
          IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffe50);
          IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
          local_30 = ::Reason_new((int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          local_34 = (int)IntView<0>::getMinLit
                                    ((IntView<0> *)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          pLVar6 = Clause::operator[]((Clause *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
          ;
          pLVar6->x = local_34;
          local_38 = (int)IntView<0>::getMaxLit
                                    ((IntView<0> *)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          pLVar6 = Clause::operator[]((Clause *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
          ;
          pLVar6->x = local_38;
          iVar5 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
          for (local_3c = (uint)iVar5; uVar1 = local_3c,
              iVar5 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffe50),
              (int)uVar1 <= (int)iVar5; local_3c = local_3c + 1) {
            iVar4 = local_3c + 3;
            iVar5 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
            local_40 = iVar4 - (int)iVar5;
            bVar2 = IntView<0>::indomain
                              ((IntView<0> *)in_stack_fffffffffffffe50,
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            if (bVar2) {
              vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_3c);
              local_48 = (int)IntView<0>::getLit(in_stack_fffffffffffffe58,
                                                 (int64_t)in_stack_fffffffffffffe50,
                                                 in_stack_fffffffffffffe4c);
              local_44 = (int)operator~((Lit)0x25ee2e);
              pLVar6 = Clause::operator[]((Clause *)in_stack_fffffffffffffe50,
                                          in_stack_fffffffffffffe4c);
              pLVar6->x = local_44;
            }
            else {
              local_50 = (int)IntView<0>::getLit(in_stack_fffffffffffffe58,
                                                 (int64_t)in_stack_fffffffffffffe50,
                                                 in_stack_fffffffffffffe4c);
              local_4c = (int)operator~((Lit)0x25ee7f);
              pLVar6 = Clause::operator[]((Clause *)in_stack_fffffffffffffe50,
                                          in_stack_fffffffffffffe4c);
              pLVar6->x = local_4c;
            }
          }
        }
        in_stack_fffffffffffffe68 = (Reason *)(in_RDI + 0x18);
        in_stack_fffffffffffffe70 = (long)local_14;
        Reason::Reason(&local_58,local_30);
        r_00.field_0._a._4_4_ = in_stack_fffffffffffffe64;
        r_00.field_0._a._0_4_ = in_stack_fffffffffffffe60;
        bVar2 = IntView<0>::remVal(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50,r_00
                                   ,SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      else {
        for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
          *(uint *)(*(long *)(in_RDI + 0x58) + (long)local_5c * 4) = local_20[local_5c];
        }
        local_60 = local_24;
        while (in_stack_fffffffffffffe64 = local_60,
              iVar4 = Tint::operator_cast_to_int
                                ((Tint *)(*(long *)(in_RDI + 0x48) + (long)local_14 * 4)),
              in_stack_fffffffffffffe64 < iVar4) {
          local_20[local_60 - local_24] = local_20[local_60];
          local_60 = local_60 + 1;
        }
        iVar4 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x48) + (long)local_14 * 4));
        local_20 = local_20 + (iVar4 - local_24);
        for (local_64 = 0; local_64 < local_24; local_64 = local_64 + 1) {
          local_20[local_64] = *(uint *)(*(long *)(in_RDI + 0x58) + (long)local_64 * 4);
        }
        Tint::operator-=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      }
    }
LAB_0025f0b5:
  }
  bVar2 = IntView<0>::isFixed((IntView<0> *)0x25f0d9);
  if (bVar2) {
    iVar5 = IntView<0>::getVal((IntView<0> *)in_stack_fffffffffffffe50);
    local_68 = (uint)iVar5;
    local_70 = vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_68);
    local_78 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
    bVar2 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      Reason::Reason((Reason *)&local_80,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_84 = (int)IntView<0>::getMinLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_88 = (int)IntView<0>::getValLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        Reason::Reason(in_stack_fffffffffffffe68,
                       (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (Lit)(int)in_stack_fffffffffffffe70);
      }
      local_90 = local_80;
      r_01.field_0._a._4_4_ = in_stack_fffffffffffffe64;
      r_01.field_0._a._0_4_ = in_stack_fffffffffffffe60;
      bVar2 = IntView<0>::setMin(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50,r_01,
                                 SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
      if (!bVar2) {
        return false;
      }
    }
    local_98 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffe50);
    bVar2 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      Reason::Reason((Reason *)&local_a0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_a4 = (int)IntView<0>::getMinLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_a8 = (int)IntView<0>::getValLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        Reason::Reason(in_stack_fffffffffffffe68,
                       (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (Lit)(int)in_stack_fffffffffffffe70);
      }
      local_b0 = local_a0;
      r_02.field_0._a._4_4_ = in_stack_fffffffffffffe64;
      r_02.field_0._a._0_4_ = in_stack_fffffffffffffe60;
      bVar2 = IntView<0>::setMin(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50,r_02,
                                 SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
      if (!bVar2) {
        return false;
      }
    }
    local_b8 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffe50);
    bVar2 = IntView<0>::setMaxNotR
                      ((IntView<0> *)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      Reason::Reason((Reason *)&local_c0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_c4 = (int)IntView<0>::getMaxLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_c8 = (int)IntView<0>::getValLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        Reason::Reason(in_stack_fffffffffffffe68,
                       (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (Lit)(int)in_stack_fffffffffffffe70);
      }
      local_d0 = local_c0;
      r_03.field_0._a._4_4_ = in_stack_fffffffffffffe64;
      r_03.field_0._a._0_4_ = in_stack_fffffffffffffe60;
      bVar2 = IntView<0>::setMax(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50,r_03,
                                 SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
      if (!bVar2) {
        return false;
      }
    }
    local_d8 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffe50);
    bVar2 = IntView<0>::setMaxNotR
                      ((IntView<0> *)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      Reason::Reason((Reason *)&local_e0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_e4 = (int)IntView<0>::getMaxLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_e8 = (int)IntView<0>::getValLit
                                  ((IntView<0> *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        Reason::Reason(in_stack_fffffffffffffe68,
                       (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (Lit)(int)in_stack_fffffffffffffe70);
      }
      local_f0 = local_e0;
      r_04.field_0._a._4_4_ = in_stack_fffffffffffffe64;
      r_04.field_0._a._0_4_ = in_stack_fffffffffffffe60;
      bVar2 = IntView<0>::setMax(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50,r_04,
                                 SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
      if (!bVar2) {
        return false;
      }
    }
    vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_68);
    IntView<0>::begin((IntView<0> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    do {
      vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_68);
      IntView<0>::end((IntView<0> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      bVar2 = IntView<0>::iterator::operator!=
                        (in_stack_fffffffffffffe50,
                         (iterator *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (!bVar2) goto LAB_0025f627;
      IntView<0>::iterator::operator++(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_124 = IntView<0>::iterator::operator*(in_stack_fffffffffffffe50);
      bVar2 = IntView<0>::indomain
                        ((IntView<0> *)in_stack_fffffffffffffe50,
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffe60 = in_stack_fffffffffffffe60 & 0xffffff;
      if (!bVar2) {
        in_stack_fffffffffffffe50 =
             (iterator *)vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x38),local_68);
        this_00 = (IntView<0> *)(long)local_124;
        if ((so.lazy & 1U) == 0) {
          Reason::Reason(local_148);
        }
        else {
          IntView<0>::getLit(this_00,(int64_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          operator~((Lit)0x25f59f);
          IntView<0>::getLit(this_00,(int64_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          operator~((Lit)0x25f5cb);
          Reason::Reason(in_stack_fffffffffffffe68,
                         (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                         (Lit)(int)in_stack_fffffffffffffe70);
        }
        r_05.field_0._a._4_4_ = in_stack_fffffffffffffe64;
        r_05.field_0._a._0_4_ = in_stack_fffffffffffffe60;
        bVar2 = IntView<0>::remVal(this_00,(int64_t)in_stack_fffffffffffffe50,r_05,
                                   SUB41((uint)in_stack_fffffffffffffe4c >> 0x18,0));
        in_stack_fffffffffffffe60 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe60) ^ 0xff000000;
      }
    } while ((in_stack_fffffffffffffe60 & 0x1000000) == 0);
    local_1 = false;
  }
  else {
LAB_0025f627:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}